

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int read_Digests(archive_read *a,_7z_digests *d,size_t num)

{
  long lVar1;
  int iVar2;
  uint32_t uVar3;
  void *pvVar4;
  uchar *puVar5;
  archive_vtable_conflict *paVar6;
  uchar *in_RDX;
  archive_read *in_RSI;
  uint i;
  uchar *p;
  uint local_2c;
  int local_4;
  
  if (in_RDX == (uchar *)0x0) {
    local_4 = -1;
  }
  else {
    memset(in_RSI,0,0x10);
    pvVar4 = malloc((size_t)in_RDX);
    *(void **)&in_RSI->archive = pvVar4;
    lVar1._0_4_ = (in_RSI->archive).magic;
    lVar1._4_4_ = (in_RSI->archive).state;
    if (lVar1 == 0) {
      local_4 = -1;
    }
    else {
      puVar5 = header_bytes(in_RSI,(size_t)in_RDX);
      if (puVar5 == (uchar *)0x0) {
        local_4 = -1;
      }
      else {
        if (*puVar5 == '\0') {
          iVar2 = read_Bools(in_RSI,in_RDX,(size_t)puVar5);
          if (iVar2 < 0) {
            return -1;
          }
        }
        else {
          memset(*(void **)&in_RSI->archive,1,(size_t)in_RDX);
        }
        paVar6 = (archive_vtable_conflict *)calloc((size_t)in_RDX,4);
        (in_RSI->archive).vtable = paVar6;
        if ((in_RSI->archive).vtable == (archive_vtable_conflict *)0x0) {
          local_4 = -1;
        }
        else {
          for (local_2c = 0; (uchar *)(ulong)local_2c < in_RDX; local_2c = local_2c + 1) {
            if (*(char *)(*(long *)&in_RSI->archive + (ulong)local_2c) != '\0') {
              puVar5 = header_bytes(in_RSI,(size_t)in_RDX);
              if (puVar5 == (uchar *)0x0) {
                return -1;
              }
              uVar3 = archive_le32dec(puVar5);
              *(uint32_t *)((long)&((in_RSI->archive).vtable)->archive_close + (ulong)local_2c * 4)
                   = uVar3;
            }
          }
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int
read_Digests(struct archive_read *a, struct _7z_digests *d, size_t num)
{
	const unsigned char *p;
	unsigned i;

	if (num == 0)
		return (-1);
	memset(d, 0, sizeof(*d));

	d->defineds = malloc(num);
	if (d->defineds == NULL)
		return (-1);
	/*
	 * Read Bools.
	 */
	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == 0) {
		if (read_Bools(a, d->defineds, num) < 0)
			return (-1);
	} else
		/* All are defined */
		memset(d->defineds, 1, num);

	d->digests = calloc(num, sizeof(*d->digests));
	if (d->digests == NULL)
		return (-1);
	for (i = 0; i < num; i++) {
		if (d->defineds[i]) {
			if ((p = header_bytes(a, 4)) == NULL)
				return (-1);
			d->digests[i] = archive_le32dec(p);
		}
	}

	return (0);
}